

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixels.c
# Opt level: O3

ALLEGRO_COLOR al_premul_rgba_f(float r,float g,float b,float a)

{
  ALLEGRO_COLOR AVar1;
  
  AVar1.r = r * a;
  AVar1.g = g * a;
  AVar1.a = a;
  AVar1.b = b * a;
  return AVar1;
}

Assistant:

ALLEGRO_COLOR al_premul_rgba_f(float r, float g, float b, float a)
{
   ALLEGRO_COLOR color;
   color.r = r * a;
   color.g = g * a;
   color.b = b * a;
   color.a = a;
   return color;
}